

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Environment *this;
  VkDescriptorPool *this_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data;
  allocator<char> local_171;
  string local_170;
  Move<vk::Handle<(vk::HandleType)22>_> local_140;
  RefData<vk::Handle<(vk::HandleType)22>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj;
  Resources res;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  this = (Environment *)
         &res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
          deleter.m_allocator;
  Environment::Environment(this,context,1);
  this_00 = &obj.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool;
  DescriptorSet::Resources::Resources((Resources *)this_00,this,params);
  DescriptorSet::create(&local_140,this,(Resources *)this_00,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data.object.m_internal = local_120.object.m_internal;
  data.deleter.m_device = local_120.deleter.m_device;
  data.deleter.m_pool.m_internal = local_120.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_100,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_140);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Ok",&local_171);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  DescriptorSet::Resources::~Resources
            ((Resources *)&obj.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool)
  ;
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}